

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O3

void psh_glyph_save_points(PSH_Glyph glyph,FT_Int dimension)

{
  byte *pbVar1;
  char *pcVar2;
  uint uVar3;
  FT_Vector *pFVar4;
  FT_Pos *pFVar5;
  ulong uVar6;
  FT_Vector *pFVar7;
  
  uVar3 = glyph->num_points;
  if (uVar3 != 0) {
    pFVar4 = glyph->outline->points;
    pcVar2 = glyph->outline->tags;
    pFVar5 = &glyph->points->cur_u;
    uVar6 = 0;
    do {
      pFVar7 = (FT_Vector *)&pFVar4->y;
      if (dimension == 0) {
        pFVar7 = pFVar4;
      }
      pFVar7->x = *pFVar5;
      if ((*pFVar5 & 0x1000000000) != 0) {
        pbVar1 = (byte *)(pcVar2 + uVar6);
        *pbVar1 = *pbVar1 | (dimension != 0) * ' ' + 0x20U;
        uVar3 = glyph->num_points;
      }
      uVar6 = uVar6 + 1;
      pFVar4 = pFVar4 + 1;
      pFVar5 = pFVar5 + 9;
    } while (uVar6 < uVar3);
  }
  return;
}

Assistant:

static void
  psh_glyph_save_points( PSH_Glyph  glyph,
                         FT_Int     dimension )
  {
    FT_UInt     n;
    PSH_Point   point = glyph->points;
    FT_Vector*  vec   = glyph->outline->points;
    char*       tags  = glyph->outline->tags;


    for ( n = 0; n < glyph->num_points; n++ )
    {
      if ( dimension == 0 )
        vec[n].x = point->cur_u;
      else
        vec[n].y = point->cur_u;

      if ( psh_point_is_strong( point ) )
        tags[n] |= (char)( ( dimension == 0 ) ? 32 : 64 );

#ifdef DEBUG_HINTER

      if ( dimension == 0 )
      {
        point->cur_x   = point->cur_u;
        point->flags_x = point->flags2 | point->flags;
      }
      else
      {
        point->cur_y   = point->cur_u;
        point->flags_y = point->flags2 | point->flags;
      }

#endif

      point++;
    }
  }